

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

Vector3D * __thiscall CMU462::Application::getMouseProjection(Application *this,double dist)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  long in_RSI;
  Vector3D *in_RDI;
  float fVar4;
  float fVar5;
  double in_XMM0_Qa;
  double dVar6;
  float fVar7;
  undefined1 auVar8 [16];
  double t;
  Vector3D ray_orig;
  Vector3D ray_wor;
  Vector4D ray_wor4;
  bool invalid;
  float zFar;
  float zNear;
  GLfloat z2;
  GLfloat z1;
  Vector4D ray_eye;
  Vector4D ray_clip;
  double y;
  double x;
  Matrix4x4 modelview_matrix;
  GLdouble modelview [16];
  Matrix4x4 projection_matrix;
  GLdouble projection [16];
  Vector3D *intersect;
  Matrix4x4 *in_stack_000004e8;
  Camera *this_00;
  undefined3 uVar9;
  undefined4 in_stack_fffffffffffffbd0;
  uint uVar11;
  float fVar12;
  Vector4D *this_01;
  double *in_stack_fffffffffffffbf8;
  PFNGLBINDFRAMEBUFFERPROC *pp_Var13;
  undefined4 in_stack_fffffffffffffc00;
  undefined4 in_stack_fffffffffffffc04;
  GLenum GVar14;
  float local_3f0;
  float local_3e4;
  float local_3a4;
  Vector3D local_370;
  double local_358;
  Vector4D *in_stack_fffffffffffffcc0;
  Matrix4x4 *in_stack_fffffffffffffcc8;
  double local_320;
  double local_318;
  double local_310;
  float local_2f0;
  float local_2ec [37];
  double local_258;
  double local_250;
  Vector4D local_248;
  double local_228;
  double local_220;
  double local_18;
  uint uVar10;
  
  local_18 = in_XMM0_Qa;
  glGetDoublev(0xba7);
  Matrix4x4::Matrix4x4
            ((Matrix4x4 *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
             in_stack_fffffffffffffbf8);
  glGetDoublev(0xba6);
  Matrix4x4::Matrix4x4
            ((Matrix4x4 *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
             in_stack_fffffffffffffbf8);
  local_3a4 = (float)*(ulong *)(in_RSI + 0x220);
  local_220 = (double)((*(float *)(in_RSI + 0x358) + *(float *)(in_RSI + 0x358)) / local_3a4 + -1.0)
  ;
  local_3e4 = (float)*(ulong *)(in_RSI + 0x228);
  dVar6 = (double)(local_3e4 - *(float *)(in_RSI + 0x35c));
  uVar1 = *(undefined8 *)(in_RSI + 0x228);
  auVar8._8_4_ = (int)((ulong)uVar1 >> 0x20);
  auVar8._0_8_ = uVar1;
  auVar8._12_4_ = 0x45300000;
  local_228 = (dVar6 + dVar6) /
              ((auVar8._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) + -1.0;
  this_01 = &local_248;
  Vector4D::Vector4D(this_01,local_220,local_228,-1.0,1.0);
  Matrix4x4::inv(in_stack_000004e8);
  Matrix4x4::operator*(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
  local_258 = -1.0;
  local_250 = 0.0;
  dVar6 = Camera::near_clip((Camera *)(in_RSI + 0x60));
  fVar4 = (float)dVar6;
  dVar6 = Camera::far_clip((Camera *)(in_RSI + 0x60));
  fVar5 = (float)dVar6;
  pp_Var13 = &__glewBindFramebuffer;
  GVar14 = 0x8ca8;
  (*__glewBindFramebuffer)(0x8ca8,*(GLuint *)(in_RSI + 0x480));
  local_3f0 = (float)*(ulong *)(in_RSI + 0x228);
  glReadPixels((int)*(float *)(in_RSI + 0x358),(int)(local_3f0 - *(float *)(in_RSI + 0x35c)),1,1,
               0x1902,0x1406,local_2ec);
  local_2ec[0] = ((fVar4 + fVar4) * fVar5) /
                 ((fVar5 + fVar4) - (local_2ec[0] + local_2ec[0] + -1.0) * (fVar5 - fVar4));
  (**pp_Var13)(GVar14,*(GLuint *)(in_RSI + 0x474));
  iVar3 = (int)*(float *)(in_RSI + 0x358);
  fVar7 = (float)(long)*(ulong *)(in_RSI + 0x228);
  fVar12 = (float)*(ulong *)(in_RSI + 0x228);
  this_00 = (Camera *)&local_2f0;
  glReadPixels(iVar3,(int)(fVar12 - *(float *)(in_RSI + 0x35c)),1,1,0x1902,0x1406);
  local_2f0 = (fVar4 * 2.0 * fVar5) /
              (-(local_2f0 + local_2f0 + -1.0) * (fVar5 - fVar4) + fVar5 + fVar4);
  (*__glewBindFramebuffer)(0x8ca8,0);
  uVar9 = (undefined3)in_stack_fffffffffffffbd0;
  uVar10 = CONCAT13(1,uVar9);
  if (((fVar4 < local_2ec[0]) && (uVar10 = CONCAT13(1,uVar9), fVar4 < local_2f0)) &&
     (uVar10 = CONCAT13(1,uVar9), local_2ec[0] < fVar5)) {
    uVar10 = CONCAT13(fVar5 <= local_2f0,uVar9);
  }
  uVar11 = uVar10;
  Matrix4x4::operator*(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
  Vector3D::Vector3D((Vector3D *)&stack0xfffffffffffffcc8,local_320,local_318,local_310);
  Camera::position(this_00);
  Vector3D::operator-((Vector3D *)this_00);
  local_358 = dot((Vector3D *)&stack0xfffffffffffffcb0,&local_370);
  bVar2 = std::isfinite(local_18);
  if (bVar2) {
    Vector3D::unit((Vector3D *)this_01);
    local_358 = local_18;
  }
  else if ((uVar10 & 0x1000000) == 0) {
    local_358 = (double)(local_2ec[0] + (local_2f0 - local_2ec[0]) / 2.0);
  }
  CMU462::operator*((double *)CONCAT44(fVar12,fVar7),(Vector3D *)CONCAT44(iVar3,uVar11));
  Vector3D::operator+((Vector3D *)CONCAT44(fVar12,fVar7),(Vector3D *)CONCAT44(iVar3,uVar11));
  return in_RDI;
}

Assistant:

Vector3D Application::getMouseProjection(double dist) {
  // get projection matrix from OpenGL stack.
  GLdouble projection[16];
  glGetDoublev(GL_PROJECTION_MATRIX, projection);
  Matrix4x4 projection_matrix(projection);

  // get view matrix from OpenGL stack.
  GLdouble modelview[16];
  glGetDoublev(GL_MODELVIEW_MATRIX, modelview);
  Matrix4x4 modelview_matrix(modelview);

  // ray in clip coordinates
  double x = mouseX * 2 / screenW - 1;
  double y = screenH - mouseY;  // y is upside down
  y = y * 2 / screenH - 1;

  Vector4D ray_clip(x, y, -1.0, 1.0);
  // ray in eye coordinates
  Vector4D ray_eye = projection_matrix.inv() * ray_clip;

  // ray is into the screen and not a point.
  ray_eye.z = -1.0;
  ray_eye.w = 0.0;

  GLfloat z1, z2;
  const float zNear = camera.near_clip();
  const float zFar = camera.far_clip();
  glBindFramebuffer(GL_READ_FRAMEBUFFER, frntface_fbo);
  glReadPixels(mouseX, screenH-mouseY, 1, 1, GL_DEPTH_COMPONENT, GL_FLOAT, &z1);
  z1 = z1 * 2.f - 1.f;
  z1 = 2.f * zNear * zFar / (zFar + zNear - z1 * (zFar - zNear));
  glBindFramebuffer(GL_READ_FRAMEBUFFER, backface_fbo);
  glReadPixels(mouseX, screenH-mouseY, 1, 1, GL_DEPTH_COMPONENT, GL_FLOAT, &z2);
  z2 = z2 * 2.f - 1.f;
  z2 = 2.f * zNear * zFar / (zFar + zNear - z2 * (zFar - zNear));
  glBindFramebuffer(GL_READ_FRAMEBUFFER, 0);

  bool invalid = (z1 <= zNear || z2 <= zNear || z1 >= zFar || z2 >= zFar);

  // ray in world coordinates
  Vector4D ray_wor4 = modelview_matrix * ray_eye;
  Vector3D ray_wor(ray_wor4.x, ray_wor4.y, ray_wor4.z);

  Vector3D ray_orig(camera.position());

  double t = dot(ray_orig, -ray_wor);
  if(std::isfinite(dist)) {
    // If a distance was given, use that instead
    ray_wor = ray_wor.unit();
    t = dist;
  } else if(!invalid) {
    // The current ray  is not a unit vector - it is normalized in z
    // so we can simply move along that (scaled) ray by the viewspace
    // z value
    t = z1 + (z2 - z1) / 2.f; // average of in/out depth
  }

  Vector3D intersect = ray_orig + t * ray_wor;

  return intersect;
}